

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>
          (AssertionExpr *this,MonitorVisitor *visitor)

{
  long lVar1;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    switch((((SequenceWithMatchExpr *)this)->super_AssertionExpr).kind) {
    case Invalid:
      return;
    case Simple:
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                ((Expression *)((SequenceWithMatchExpr *)this)->expr,
                 (Expression *)((SequenceWithMatchExpr *)this)->expr,visitor);
      return;
    case SequenceConcat:
      SequenceConcatExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
                ((SequenceConcatExpr *)this,visitor);
      return;
    case SequenceWithMatch:
      SequenceWithMatchExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
                ((SequenceWithMatchExpr *)this,visitor);
      return;
    case Unary:
      break;
    case Binary:
      visit<slang::ast::builtins::MonitorVisitor>
                (*(AssertionExpr **)
                  &(((SequenceWithMatchExpr *)this)->repetition).
                   super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload,visitor);
      lVar1 = 0x20;
      goto LAB_00397e6f;
    case FirstMatch:
      FirstMatchAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
                ((FirstMatchAssertionExpr *)this,visitor);
      return;
    case Clocking:
      TimingControl::visit<slang::ast::builtins::MonitorVisitor>
                ((TimingControl *)((SequenceWithMatchExpr *)this)->expr,visitor);
      break;
    case StrongWeak:
      lVar1 = 0x10;
      goto LAB_00397e6f;
    case Abort:
    case DisableIff:
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                ((Expression *)((SequenceWithMatchExpr *)this)->expr,
                 (Expression *)((SequenceWithMatchExpr *)this)->expr,visitor);
      break;
    case Conditional:
      ConditionalAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
                ((ConditionalAssertionExpr *)this,visitor);
      return;
    case Case:
      CaseAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
                ((CaseAssertionExpr *)this,visitor);
      return;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
        local_b0.field_2._M_allocated_capacity = *psVar3;
        local_b0.field_2._8_8_ = plVar2[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar3;
      }
      local_b0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x199);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_90 == plVar4) {
        local_80 = *plVar4;
        lStack_78 = plVar2[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
      }
      local_88 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_f0 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar2[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
      }
      local_e8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar1 = 0x18;
LAB_00397e6f:
    this = *(AssertionExpr **)
            ((long)&(((SequenceWithMatchExpr *)this)->super_AssertionExpr).kind + lVar1);
  } while( true );
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case AssertionExprKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}